

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f8484::NesMmuTest_read_write_byte_Test::TestBody
          (NesMmuTest_read_write_byte_Test *this)

{
  ushort uVar1;
  IMmu *pIVar2;
  int iVar3;
  pointer puVar4;
  char *message;
  initializer_list<unsigned_short> __l;
  uint8_t byte;
  allocator_type local_68;
  undefined7 uStack_67;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  byte = 0xf0;
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 0x100000;
  gtest_ar._4_2_ = 0x4000;
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,__l,&local_68);
  for (puVar4 = local_48._M_impl.super__Vector_impl_data._M_start;
      puVar4 != local_48._M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    pIVar2 = (this->super_NesMmuTest).mmu._M_t.
             super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
             super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
    uVar1 = *puVar4;
    (*pIVar2->_vptr_IMmu[4])(pIVar2,(ulong)uVar1,0xf0);
    pIVar2 = (this->super_NesMmuTest).mmu._M_t.
             super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
             super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
    iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,(ulong)uVar1);
    local_68 = SUB41(iVar3,0);
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)&gtest_ar,"byte","mmu->read_byte(addr)",&byte,(uchar *)&local_68);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      message = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                 ,0x30,message);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((long *)CONCAT71(uStack_67,local_68) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(uStack_67,local_68) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

TEST_F(NesMmuTest, read_write_byte) {
    const uint8_t byte = 0xF0;

    for (uint16_t addr : get_addr_list()) {
        mmu->write_byte(addr, byte);
        EXPECT_EQ(byte, mmu->read_byte(addr));
    }
}